

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

char * xml_element_name(xml_element_tag tag)

{
  char *local_20;
  char *str;
  char *pcStack_10;
  xml_element_tag tag_local;
  
  if (tag == no_element) {
    pcStack_10 = "--none--";
  }
  else {
    for (local_20 = xml_full_element_name[tag]; *local_20 != ' '; local_20 = local_20 + 1) {
    }
    pcStack_10 = local_20 + 1;
  }
  return pcStack_10;
}

Assistant:

static const char *xml_element_name(xml_element_tag tag)
{
    const char *str;

    if (tag == no_element)
    {
        return "--none--";
    }

    str = xml_full_element_name[tag];
    while (*str != ' ')
    {
        str++;
    }
    str++;
    return str;
}